

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

void Abc_NtkCountNodes(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    dVar5 = (double)pNtk->nObjCounts[7];
  }
  else {
    pVVar1 = pNtk->pDesign->vModules;
    lVar3 = (long)pVVar1->nSize;
    if (0 < lVar3) {
      ppvVar2 = pVVar1->pArray;
      lVar4 = 0;
      do {
        *(undefined8 *)((long)ppvVar2[lVar4] + 0xd0) = 0xbff0000000000000;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    dVar5 = Abc_NtkCountNodes_rec(pNtk);
  }
  printf("Nodes = %.0f\n",dVar5);
  return;
}

Assistant:

void Abc_NtkCountNodes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    double Counter;
    int i;

    if ( pNtk->pDesign == NULL )
        Counter = Abc_NtkNodeNum(pNtk);
    else
    {
        vMods = pNtk->pDesign->vModules;
        Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
            pModel->dTemp = -1;
        Counter = Abc_NtkCountNodes_rec( pNtk );
    }
    printf( "Nodes = %.0f\n", Counter );
}